

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::DynamicMapField::SpaceUsedExcludingSelfNoLock(DynamicMapField *this)

{
  RepeatedPtrFieldBase *this_00;
  size_type sVar1;
  CppType CVar2;
  size_t sVar3;
  Message *message;
  size_t sVar4;
  Reflection *this_01;
  long lVar5;
  long lVar6;
  const_iterator it;
  
  this_00 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_00 == (RepeatedPtrFieldBase *)0x0) {
    sVar3 = 0x18;
  }
  else {
    sVar3 = RepeatedPtrFieldBase::
            SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                      (this_00);
    sVar3 = sVar3 + 0x18;
  }
  sVar1 = ((this->map_).elements_)->num_elements_;
  if (sVar1 != 0) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(&it,&this->map_);
    lVar6 = sVar1 * 0x20;
    CVar2 = MapKey::type(&(((it.it_.node_)->kv).v_)->first);
    lVar5 = 0;
    if (CVar2 == CPPTYPE_STRING) {
      lVar5 = lVar6;
    }
    sVar3 = lVar5 + sVar3 + lVar6;
    CVar2 = MapValueRef::type(&(((it.it_.node_)->kv).v_)->second);
    switch(CVar2) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
      sVar3 = sVar3 + sVar1 * 4;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
      sVar3 = sVar3 + sVar1 * 8;
      break;
    case CPPTYPE_BOOL:
      sVar3 = sVar3 + sVar1;
      break;
    case CPPTYPE_STRING:
      sVar3 = sVar3 + lVar6;
      break;
    case CPPTYPE_MESSAGE:
      while (it.it_.node_ != (Node *)0x0) {
        message = MapValueRef::GetMessageValue(&(((it.it_.node_)->kv).v_)->second);
        (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
        sVar4 = Reflection::SpaceUsedLong(this_01,message);
        sVar3 = sVar3 + sVar4;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
        ::operator++(&it.it_);
      }
    }
  }
  return sVar3;
}

Assistant:

size_t DynamicMapField::SpaceUsedExcludingSelfNoLock() const {
  size_t size = 0;
  if (MapFieldBase::repeated_field_ != NULL) {
    size += MapFieldBase::repeated_field_->SpaceUsedExcludingSelfLong();
  }
  size += sizeof(map_);
  size_t map_size = map_.size();
  if (map_size) {
    Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
    size += sizeof(it->first) * map_size;
    size += sizeof(it->second) * map_size;
    // If key is string, add the allocated space.
    if (it->first.type() == FieldDescriptor::CPPTYPE_STRING) {
      size += sizeof(std::string) * map_size;
    }
    // Add the allocated space in MapValueRef.
    switch (it->second.type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    size += sizeof(TYPE) * map_size;         \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        while (it != map_.end()) {
          const Message& message = it->second.GetMessageValue();
          size += message.GetReflection()->SpaceUsedLong(message);
          ++it;
        }
        break;
      }
    }
  }
  return size;
}